

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

Instr * __thiscall
LowererMDArch::LowerEHRegionReturn(LowererMDArch *this,Instr *insertBeforeInstr,Opnd *targetOpnd)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  RegNum reg;
  byte bVar4;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar5;
  RegOpnd *pRVar6;
  HelperCallOpnd *src1Opnd;
  undefined4 *puVar7;
  IntConstOpnd *this_00;
  
  sym = StackSym::New(TyInt64,this->m_func);
  bVar3 = IRType_IsFloat(TyInt64);
  reg = RegXMM0;
  if (!bVar3) {
    bVar3 = IRType_IsSimd128(TyInt64);
    reg = bVar3 * '\x10' + RegRAX;
  }
  dstOpnd = IR::RegOpnd::New(sym,reg,TyInt64,this->m_func);
  pIVar5 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,targetOpnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar5);
  pRVar6 = IR::RegOpnd::New((StackSym *)0x0,RegArg2,TyInt64,this->m_func);
  pIVar5 = IR::Instr::New(LdSpillSize,&pRVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar5);
  pRVar6 = IR::RegOpnd::New((StackSym *)0x0,RegArg3,TyInt64,this->m_func);
  pIVar5 = IR::Instr::New(LdArgSize,&pRVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar5);
  pRVar6 = IR::RegOpnd::New((StackSym *)0x0,RegArg0,TyInt64,this->m_func);
  src1Opnd = IR::HelperCallOpnd::New(HelperOp_ReturnFromCallWithFakeFrame,this->m_func);
  pIVar5 = IR::Instr::New(MOV,&pRVar6->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar5);
  pIVar5 = IR::Instr::New(PUSH,this->m_func);
  if (pIVar5->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00653275;
    *puVar7 = 0;
  }
  pFVar1 = pIVar5->m_func;
  if ((pRVar6->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_00653275;
    *puVar7 = 0;
  }
  bVar4 = (pRVar6->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    pRVar6 = (RegOpnd *)IR::Opnd::Copy(&pRVar6->super_Opnd,pFVar1);
    bVar4 = (pRVar6->super_Opnd).field_0xb;
  }
  (pRVar6->super_Opnd).field_0xb = bVar4 | 2;
  pIVar5->m_src1 = &pRVar6->super_Opnd;
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar5);
  this_00 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  pIVar5 = IR::Instr::New(RET,this->m_func);
  if (pIVar5->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00653275;
    *puVar7 = 0;
  }
  pFVar1 = pIVar5->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_00653275;
    *puVar7 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  pIVar5->m_src1 = &this_00->super_Opnd;
  if (pIVar5->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00653275;
    *puVar7 = 0;
  }
  pFVar1 = pIVar5->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_00653275:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  bVar4 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    dstOpnd = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar1);
    bVar4 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar4 | 2;
  pIVar5->m_src2 = &dstOpnd->super_Opnd;
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar5);
  return pIVar5;
}

Assistant:

IR::Instr *
LowererMDArch::LowerEHRegionReturn(IR::Instr * insertBeforeInstr, IR::Opnd * targetOpnd)
{
    IR::RegOpnd *retReg = IR::RegOpnd::New(StackSym::New(TyMachReg, this->m_func), GetRegReturn(TyMachReg), TyMachReg, this->m_func);

    // Load the continuation address into the return register.
    insertBeforeInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, retReg, targetOpnd, this->m_func));

    // MOV REG_EH_SPILL_SIZE, spillSize
    IR::Instr *movSpillSize = IR::Instr::New(Js::OpCode::LdSpillSize,
        IR::RegOpnd::New(nullptr, REG_EH_SPILL_SIZE, TyMachReg, m_func),
        m_func);
    insertBeforeInstr->InsertBefore(movSpillSize);


    // MOV REG_EH_ARGS_SIZE, argsSize
    IR::Instr *movArgsSize = IR::Instr::New(Js::OpCode::LdArgSize,
        IR::RegOpnd::New(nullptr, REG_EH_ARGS_SIZE, TyMachReg, m_func),
        m_func);
    insertBeforeInstr->InsertBefore(movArgsSize);

    // MOV REG_EH_TARGET, amd64_ReturnFromCallWithFakeFrame
    // PUSH REG_EH_TARGET
    // RET
    IR::Opnd *endCallWithFakeFrame = endCallWithFakeFrame =
        IR::RegOpnd::New(nullptr, REG_EH_TARGET, TyMachReg, m_func);
    IR::Instr *movTarget = IR::Instr::New(Js::OpCode::MOV,
        endCallWithFakeFrame,
        IR::HelperCallOpnd::New(IR::HelperOp_ReturnFromCallWithFakeFrame, m_func),
        m_func);
    insertBeforeInstr->InsertBefore(movTarget);

    IR::Instr *push = IR::Instr::New(Js::OpCode::PUSH, m_func);
    push->SetSrc1(endCallWithFakeFrame);
    insertBeforeInstr->InsertBefore(push);

#if 0
        // TODO: This block gets deleted if we emit a JMP instead of a RET.
    IR::BranchInstr *jmp = IR::BranchInstr::New(Js::OpCode::JMP,
        nullptr,
        targetOpnd,
        m_func);
    leaveInstr->InsertBefore(jmp);
#endif

    IR::IntConstOpnd *intSrc = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
    IR::Instr * retInstr = IR::Instr::New(Js::OpCode::RET, this->m_func);
    retInstr->SetSrc1(intSrc);
    retInstr->SetSrc2(retReg);
    insertBeforeInstr->InsertBefore(retInstr);

    // return the last instruction inserted
    return retInstr;
}